

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

uint32_t __thiscall
asmjit::CodeHolder::getLabelIdByName
          (CodeHolder *this,char *name,size_t nameLength,uint32_t parentId)

{
  int iVar1;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  LabelEntry *le;
  uint32_t hVal;
  LabelEntry *node;
  uint32_t hMod;
  uint32_t local_ec;
  void *local_e8;
  char *local_b8;
  undefined4 local_b0;
  uint32_t local_ac;
  uint32_t local_a0;
  size_t local_98;
  char *local_90;
  uint32_t local_7c;
  undefined8 *local_78;
  uint local_6c;
  char **local_68;
  long local_60;
  uint32_t local_54;
  size_t local_50;
  char *local_48;
  char **local_40;
  undefined8 *local_30;
  char **local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  int *local_10;
  uint *local_8;
  
  local_98 = in_RDX;
  local_90 = in_RSI;
  local_a0 = anon_unknown_32::CodeHolder_hashNameAndFixLen(in_RSI,&local_98);
  if (local_98 == 0) {
    local_7c = 0;
  }
  else {
    local_60 = in_RDI + 0x128;
    local_40 = &local_b8;
    local_48 = local_90;
    local_50 = local_98;
    local_b8 = local_90;
    local_b0 = (int)local_98;
    local_ac = local_a0;
    local_68 = &local_b8;
    local_6c = local_a0 % *(uint *)(in_RDI + 0x138);
    local_78 = *(undefined8 **)(*(long *)(in_RDI + 0x140) + (ulong)local_6c * 8);
    local_54 = local_a0;
    while( true ) {
      bVar2 = false;
      if (local_78 != (undefined8 *)0x0) {
        local_28 = local_68;
        local_30 = local_78;
        local_20 = local_78;
        local_10 = (int *)(local_78 + 6);
        bVar2 = false;
        if (*local_10 == *(int *)(local_68 + 1)) {
          local_18 = local_78;
          local_8 = (uint *)(local_78 + 6);
          if (*local_8 < 0xc) {
            local_e8 = (void *)((long)local_78 + 0x34);
          }
          else {
            local_e8 = (void *)local_78[7];
          }
          iVar1 = memcmp(local_e8,*local_68,(ulong)*(uint *)(local_68 + 1));
          bVar2 = iVar1 == 0;
        }
        bVar2 = (bool)(bVar2 ^ 1);
      }
      if (!bVar2) break;
      local_78 = (undefined8 *)*local_78;
    }
    if (local_78 == (undefined8 *)0x0) {
      local_ec = 0;
    }
    else {
      local_ec = *(uint32_t *)((long)local_78 + 0xc);
    }
    local_7c = local_ec;
  }
  return local_7c;
}

Assistant:

uint32_t CodeHolder::getLabelIdByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);
  if (ASMJIT_UNLIKELY(!nameLength)) return 0;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  return le ? le->getId() : static_cast<uint32_t>(0);
}